

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_unused_interface_variables_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::RemoveUnusedInterfaceVariablesContext::processFunction
          (RemoveUnusedInterfaceVariablesContext *this,Function *func)

{
  bool bVar1;
  Instruction *this_00;
  anon_class_8_1_8991fb9c local_90;
  function<void_(const_unsigned_int_*)> local_88;
  Instruction *local_68;
  Instruction *instruction;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  value_type *basic_block;
  iterator __end2;
  iterator __begin2;
  Function *__range2;
  Function *func_local;
  RemoveUnusedInterfaceVariablesContext *this_local;
  
  join_0x00000010_0x00000000_ = opt::Function::begin(func);
  _basic_block = opt::Function::end(func);
  while( true ) {
    bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_,
                       (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&basic_block);
    if (!bVar1) break;
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_);
    BasicBlock::begin((BasicBlock *)&__end3);
    BasicBlock::end((BasicBlock *)&instruction);
    while( true ) {
      bVar1 = utils::operator!=(&__end3,(iterator_template<const_spvtools::opt::Instruction> *)
                                        &instruction);
      if (!bVar1) break;
      this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
                iterator_template<const_spvtools::opt::Instruction>::operator*(&__end3);
      local_90.this = this;
      local_68 = this_00;
      std::function<void(unsigned_int_const*)>::
      function<spvtools::opt::RemoveUnusedInterfaceVariablesContext::processFunction(spvtools::opt::Function*)::_lambda(unsigned_int_const*)_1_,void>
                ((function<void(unsigned_int_const*)> *)&local_88,&local_90);
      opt::Instruction::ForEachInId(this_00,&local_88);
      std::function<void_(const_unsigned_int_*)>::~function(&local_88);
      utils::IntrusiveList<spvtools::opt::Instruction>::
      iterator_template<const_spvtools::opt::Instruction>::operator++(&__end3);
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_);
  }
  return false;
}

Assistant:

bool processFunction(Function* func) {
    for (const auto& basic_block : *func)
      for (const auto& instruction : basic_block)
        instruction.ForEachInId([&](const uint32_t* id) {
          if (used_variables_.count(*id)) return;
          auto* var = parent_.get_def_use_mgr()->GetDef(*id);
          if (!var || var->opcode() != spv::Op::OpVariable) return;
          auto storage_class =
              spv::StorageClass(var->GetSingleWordInOperand(0));
          if (storage_class != spv::StorageClass::Function &&
              (parent_.get_module()->version() >=
                   SPV_SPIRV_VERSION_WORD(1, 4) ||
               storage_class == spv::StorageClass::Input ||
               storage_class == spv::StorageClass::Output)) {
            used_variables_.insert(*id);
            operands_to_add_.push_back(*id);
          }
        });
    return false;
  }